

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * Curl_oldest_idle_connection(Curl_easy *data)

{
  connectbundle *pcVar1;
  timeval older;
  long lVar2;
  timeval newer;
  connectdata *conn;
  connectbundle *bundle;
  connectdata *conn_candidate;
  timeval now;
  long score;
  long highscore;
  curl_hash_element *he;
  curl_llist_element *curr;
  curl_hash_iterator iter;
  conncache *bc;
  Curl_easy *data_local;
  
  iter.current_element = (curl_llist_element *)(data->state).conn_cache;
  score = -1;
  bundle = (connectbundle *)0x0;
  newer = curlx_tvnow();
  Curl_hash_start_iterate((curl_hash *)iter.current_element,(curl_hash_iterator *)&curr);
  highscore = (long)Curl_hash_next_element((curl_hash_iterator *)&curr);
  while (highscore != 0) {
    for (he = (curl_hash_element *)**(undefined8 **)(*(long *)highscore + 0x10);
        he != (curl_hash_element *)0x0; he = (curl_hash_element *)he->key_len) {
      pcVar1 = (connectbundle *)he->ptr;
      if (((pcVar1[3].multiuse & 1) == 0) &&
         (older.tv_sec = pcVar1[0x13].num_connections,
         older.tv_usec = (__suseconds_t)pcVar1[0x13].conn_list, lVar2 = curlx_tvdiff(newer,older),
         score < lVar2)) {
        bundle = pcVar1;
        score = lVar2;
      }
    }
    highscore = (long)Curl_hash_next_element((curl_hash_iterator *)&curr);
  }
  return (connectdata *)bundle;
}

Assistant:

struct connectdata *
Curl_oldest_idle_connection(struct Curl_easy *data)
{
  struct conncache *bc = data->state.conn_cache;
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;
  long highscore=-1;
  long score;
  struct timeval now;
  struct connectdata *conn_candidate = NULL;
  struct connectbundle *bundle;

  now = Curl_tvnow();

  Curl_hash_start_iterate(&bc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectdata *conn;

    bundle = he->ptr;

    curr = bundle->conn_list->head;
    while(curr) {
      conn = curr->ptr;

      if(!conn->inuse) {
        /* Set higher score for the age passed since the connection was used */
        score = Curl_tvdiff(now, conn->now);

        if(score > highscore) {
          highscore = score;
          conn_candidate = conn;
        }
      }
      curr = curr->next;
    }

    he = Curl_hash_next_element(&iter);
  }

  return conn_candidate;
}